

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::is_builtin_variable(Compiler *this,SPIRVariable *var)

{
  uint32_t id;
  Meta *pMVar1;
  SPIRType *type;
  Meta *m;
  SPIRVariable *var_local;
  Compiler *this_local;
  
  pMVar1 = ParsedIR::find_meta(&this->ir,(ID)(var->super_IVariant).self.id);
  if (((var->compat_builtin & 1U) == 0) &&
     ((pMVar1 == (Meta *)0x0 || (((pMVar1->decoration).builtin & 1U) == 0)))) {
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
    type = get<diligent_spirv_cross::SPIRType>(this,id);
    this_local._7_1_ = is_builtin_type(this,type);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::is_builtin_variable(const SPIRVariable &var) const
{
	auto *m = ir.find_meta(var.self);

	if (var.compat_builtin || (m && m->decoration.builtin))
		return true;
	else
		return is_builtin_type(get<SPIRType>(var.basetype));
}